

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  int64_t iVar4;
  int i;
  int iVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int64_t u;
  ulong uVar11;
  ulong uVar12;
  int64_t v;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  undefined8 uStack_138;
  secp256k1_modinv64_modinfo *local_130;
  secp256k1_modinv64_signed62 g;
  ulong local_e8 [2];
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 local_58;
  
  d.v[4] = 0;
  d.v[2] = 0;
  d.v[3] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  local_58.v[3] = 0;
  local_58.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[2] = 0;
  local_58.v[0] = 1;
  f.v[4] = (modinfo->modulus).v[4];
  f.v[0] = (modinfo->modulus).v[0];
  f.v[1] = (modinfo->modulus).v[1];
  f.v[2] = (modinfo->modulus).v[2];
  f.v[3] = (modinfo->modulus).v[3];
  g.v[4] = x->v[4];
  g.v[0] = x->v[0];
  g.v[1] = x->v[1];
  g.v[2] = x->v[2];
  g.v[3] = x->v[3];
  uStack_138._4_4_ = 5;
  lVar21 = -1;
  local_130 = modinfo;
  do {
    iVar4 = f.v[0];
    iVar3 = g.v[0];
    uVar11 = 1;
    uVar13 = 0;
    uVar22 = 0;
    iVar5 = 0x3e;
    uVar10 = g.v[0];
    uVar18 = f.v[0];
    uVar19 = uVar11;
    while( true ) {
      uVar15 = -1L << ((byte)iVar5 & 0x3f) | uVar10;
      lVar20 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      bVar6 = (byte)lVar20;
      uVar15 = uVar10 >> (bVar6 & 0x3f);
      uVar11 = uVar11 << (bVar6 & 0x3f);
      uVar13 = uVar13 << (bVar6 & 0x3f);
      lVar21 = lVar21 - lVar20;
      iVar5 = iVar5 - (int)lVar20;
      if (iVar5 == 0) break;
      iVar9 = (int)uVar15;
      if (lVar21 < 0) {
        lVar21 = -lVar21;
        uVar10 = -uVar18;
        uVar12 = -uVar11;
        uVar18 = -uVar13;
        iVar8 = (int)lVar21 + 1;
        cVar7 = (char)iVar8;
        if (iVar5 <= iVar8) {
          cVar7 = (char)iVar5;
        }
        uVar14 = (uint)(0xffffffffffffffff >> (-cVar7 & 0x3fU)) &
                 (iVar9 * iVar9 + 0x3e) * iVar9 * (int)uVar10 & 0x3f;
        uVar13 = uVar19;
        uVar11 = uVar22;
      }
      else {
        iVar8 = (int)lVar21 + 1;
        cVar7 = (char)iVar8;
        if (iVar5 <= iVar8) {
          cVar7 = (char)iVar5;
        }
        uVar14 = (uint)(0xffffffffffffffff >> (-cVar7 & 0x3fU)) &
                 -(iVar9 * (((int)uVar18 * 2 + 2U & 8) + (int)uVar18)) & 0xf;
        uVar12 = uVar22;
        uVar10 = uVar15;
        uVar15 = uVar18;
        uVar18 = uVar19;
      }
      uVar19 = (ulong)uVar14;
      uVar10 = uVar10 + uVar19 * uVar15;
      uVar22 = uVar11 * uVar19 + uVar12;
      uVar19 = uVar18 + uVar19 * uVar13;
      uVar18 = uVar15;
    }
    t.u = uVar11;
    t.v = uVar13;
    t.q = uVar22;
    t.r = uVar19;
    secp256k1_modinv64_update_de_62(&d,&local_58,&t,local_130);
    uVar18 = uVar13 * iVar3 + uVar11 * iVar4;
    lVar17 = SUB168(SEXT816((long)uVar13) * SEXT816(iVar3),8) +
             SUB168(SEXT816((long)uVar11) * SEXT816(iVar4),8) +
             (ulong)CARRY8(uVar13 * iVar3,uVar11 * iVar4);
    local_e8[0] = uVar22;
    local_e8[1] = uVar19;
    uVar10 = uVar19 * iVar3 + uVar22 * iVar4;
    lVar16 = SUB168(SEXT816((long)uVar19) * SEXT816(iVar3),8) +
             SUB168(SEXT816((long)uVar22) * SEXT816(iVar4),8) +
             (ulong)CARRY8(uVar19 * iVar3,uVar22 * iVar4);
    lVar23 = (long)uStack_138._4_4_;
    lVar20 = 1;
    while( true ) {
      uVar19 = uVar10 >> 0x3e | lVar16 << 2;
      uVar22 = uVar18 >> 0x3e | lVar17 << 2;
      if (lVar23 <= lVar20) break;
      lVar1 = f.v[lVar20];
      lVar2 = g.v[lVar20];
      uVar10 = lVar1 * uVar11 + uVar22;
      uVar18 = uVar10 + lVar2 * uVar13;
      lVar17 = SUB168(SEXT816(lVar1) * SEXT816((long)uVar11),8) + (lVar17 >> 0x3e) +
               (ulong)CARRY8(lVar1 * uVar11,uVar22) +
               SUB168(SEXT816(lVar2) * SEXT816((long)uVar13),8) +
               (ulong)CARRY8(uVar10,lVar2 * uVar13);
      uVar22 = lVar1 * local_e8[0] + uVar19;
      uVar10 = uVar22 + lVar2 * local_e8[1];
      lVar16 = SUB168(SEXT816(lVar1) * SEXT816((long)local_e8[0]),8) + (lVar16 >> 0x3e) +
               (ulong)CARRY8(lVar1 * local_e8[0],uVar19) +
               SUB168(SEXT816(lVar2) * SEXT816((long)local_e8[1]),8) +
               (ulong)CARRY8(uVar22,lVar2 * local_e8[1]);
      f.v[lVar20 + -1] = uVar18 & 0x3fffffffffffffff;
      g.v[lVar20 + -1] = uVar10 & 0x3fffffffffffffff;
      lVar20 = lVar20 + 1;
    }
    f.v[lVar23 + -1] = uVar22;
    g.v[lVar23 + -1] = uVar19;
    lVar20 = 1;
    if (g.v[0] == 0) {
      uVar13 = 0;
      for (; lVar20 < lVar23; lVar20 = lVar20 + 1) {
        uVar13 = uVar13 | g.v[lVar20];
      }
      if (uVar13 == 0) {
        secp256k1_modinv64_normalize_62(&d,uVar22,local_130);
        x->v[4] = d.v[4];
        x->v[2] = d.v[2];
        x->v[3] = d.v[3];
        x->v[0] = d.v[0];
        x->v[1] = d.v[1];
        return;
      }
    }
    if ((long)uVar19 >> 0x3f == uVar19 && ((long)uVar22 >> 0x3f == uVar22 && -1 < lVar23 + -2)) {
      uStack_138._4_4_ = uStack_138._4_4_ + -1;
      local_e8[lVar23] = local_e8[lVar23] | (uVar18 >> 0x3e) << 0x3e;
      (&uStack_138)[lVar23] = (&uStack_138)[lVar23] | (uVar10 >> 0x3e) << 0x3e;
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }
#ifdef VERIFY
        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  (secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}